

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O1

void __thiscall
Well<unsigned_int,32ul,17ul,23ul,13ul,11ul,10ul,Detail::M3<-13>,Detail::M3<-15>,Detail::M1,Detail::M2<-21>,Detail::M3<-13>,Detail::M2<1>,Detail::M0,Detail::M3<11>,Detail::NoTempering>
::seed<unsigned_int*>
          (Well<unsigned_int,32ul,17ul,23ul,13ul,11ul,10ul,Detail::M3<_13>,Detail::M3<_15>,Detail::M1,Detail::M2<_21>,Detail::M3<_13>,Detail::M2<1>,Detail::M0,Detail::M3<11>,Detail::NoTempering>
           *this,uint **first,uint *last)

{
  bool bVar1;
  uint *puVar2;
  invalid_argument *this_00;
  long lVar3;
  
  *(undefined8 *)(this + 0x48) = 0;
  puVar2 = *first;
  if (puVar2 == last) {
    bVar1 = true;
  }
  else {
    lVar3 = 0;
    do {
      *(uint *)(this + lVar3 * 4) = *puVar2;
      puVar2 = puVar2 + 1;
      bVar1 = lVar3 != 0x10;
      if (lVar3 == 0x10) break;
      lVar3 = lVar3 + 1;
    } while (puVar2 != last);
    *first = puVar2;
  }
  if ((bVar1) && (*first == last)) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Seed sequence too short");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return;
}

Assistant:

void seed(InputIterator& first, InputIterator last)
    {
        index_ = 0;
        std::size_t i = 0;

        for ( ; i != state_size && first != last; ++i, ++first)
            state_[i] = *first;

        if (first == last && i != state_size)
            throw std::invalid_argument("Seed sequence too short");
    }